

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

ktx_error_code_e ktxPrintInfoForStream(ktxStream *stream)

{
  ktx_error_code_e kVar1;
  int iVar2;
  anon_union_80_2_131c2913 header;
  
  if (stream != (ktxStream *)0x0) {
    kVar1 = (*stream->read)(stream,&header,0xc);
    if (kVar1 == KTX_SUCCESS) {
      iVar2 = bcmp(&header,&DAT_00260b08,0xc);
      if (iVar2 == 0) {
        kVar1 = (*stream->read)(stream,&header.ktx.endianness,0x34);
        printKTXInfo2(stream,&header.ktx);
      }
      else {
        iVar2 = bcmp(&header,&DAT_00260b14,0xc);
        if (iVar2 == 0) {
          kVar1 = (*stream->read)(stream,&header.ktx.endianness,0x44);
          if (kVar1 == KTX_SUCCESS) {
            kVar1 = printKTX2Info2(stream,&header.ktx2);
          }
        }
        else {
          kVar1 = KTX_UNKNOWN_FILE_FORMAT;
        }
      }
    }
    return kVar1;
  }
  __assert_fail("stream != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/info.c"
                ,0x41e,"ktx_error_code_e ktxPrintInfoForStream(ktxStream *)");
}

Assistant:

KTX_error_code
ktxPrintInfoForStream(ktxStream* stream)
{
    enum { KTX, KTX2 } fileType;
    ktx_uint8_t ktx_ident_ref[12] = KTX_IDENTIFIER_REF;
    ktx_uint8_t ktx2_ident_ref[12] = KTX2_IDENTIFIER_REF;
    union {
        KTX_header ktx;
        KTX_header2 ktx2;
    } header;
    KTX_error_code result;

    assert(stream != NULL);

    result = stream->read(stream, &header, sizeof(ktx2_ident_ref));
    if (result == KTX_SUCCESS) {
        // Compare identifier, is this a KTX  or KTX2 file?
        if (!memcmp(header.ktx.identifier, ktx_ident_ref, 12)) {
                fileType = KTX;
        } else if (!memcmp(header.ktx2.identifier, ktx2_ident_ref, 12)) {
                fileType = KTX2;
        } else {
                return KTX_UNKNOWN_FILE_FORMAT;
        }
        if (fileType == KTX) {
            // Read rest of header.
            result = stream->read(stream, &header.ktx.endianness,
                                  KTX_HEADER_SIZE - sizeof(ktx_ident_ref));
            printKTXInfo2(stream, &header.ktx);
        } else {
            // Read rest of header.
            result = stream->read(stream, &header.ktx2.vkFormat,
                                 KTX2_HEADER_SIZE - sizeof(ktx2_ident_ref));
            if (result != KTX_SUCCESS)
                return result;
            result = printKTX2Info2(stream, &header.ktx2);
        }
    }
    return result;
}